

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxNodeHeap.h
# Opt level: O3

void __thiscall maxNodeHeap::decreaseKey(maxNodeHeap *this,NodeID node,Gain gain)

{
  pointer pQVar1;
  pointer ppVar2;
  pointer ppVar3;
  int iVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  int __tmp;
  int iVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  pointer ppVar11;
  key_type local_14;
  
  pmVar5 = std::__detail::
           _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->m_element_index,&local_14);
  pQVar1 = (this->m_elements).
           super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)pQVar1[*pmVar5].m_index;
  pQVar1[*pmVar5].m_key = gain;
  ppVar2 = (this->m_heap).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar2[uVar6].first = gain;
  pQVar1 = (this->m_elements).
           super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = (this->m_heap).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    iVar4 = (int)uVar6;
    uVar8 = iVar4 * 2 + 1;
    uVar9 = iVar4 * 2 + 2;
    iVar7 = (int)((ulong)((long)ppVar3 - (long)ppVar2) >> 3);
    if ((int)uVar9 < iVar7) {
      if ((ppVar2[(int)uVar8].first < gain) && (ppVar2[(int)uVar9].first < gain)) {
        return;
      }
      if (ppVar2[(int)uVar8].first <= ppVar2[(int)uVar9].first) {
        uVar8 = uVar9;
      }
      lVar10 = (long)(int)uVar8;
      ppVar11 = ppVar2 + lVar10;
      iVar7 = ppVar11->first;
    }
    else {
      if (iVar7 <= (int)uVar8) {
        return;
      }
      lVar10 = (long)(int)uVar8;
      iVar7 = ppVar2[lVar10].first;
      if (iVar7 <= gain) {
        return;
      }
      ppVar11 = ppVar2 + lVar10;
    }
    ppVar2[iVar4].first = iVar7;
    ppVar2[lVar10].first = gain;
    iVar7 = ppVar2[iVar4].second;
    ppVar2[iVar4].second = ppVar11->second;
    ppVar11->second = iVar7;
    pQVar1[ppVar2[iVar4].second].m_index = iVar4;
    pQVar1[iVar7].m_index = uVar8;
    gain = ppVar2[lVar10].first;
    uVar6 = (ulong)uVar8;
  } while( true );
}

Assistant:

inline void maxNodeHeap::decreaseKey(NodeID node, Gain gain) {
        int queue_idx = m_element_index[node];
        int heap_idx  = m_elements[queue_idx].get_index();
        m_elements[queue_idx].set_key(gain);
        m_heap[heap_idx].first = gain;
        siftDown(heap_idx);
}